

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cpp
# Opt level: O1

string * stop_bits_to_text_abi_cxx11_(string *__return_storage_ptr__,stop_bits b)

{
  char *pcVar1;
  char *pcVar2;
  
  if (b.value_ == two) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "2";
    pcVar1 = "";
  }
  else if (b.value_ == onepointfive) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "1.5";
    pcVar1 = "";
  }
  else {
    if (b.value_ != one) {
      __assert_fail("!\"can\'t be\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]multi_serial_dump/interface.cpp"
                    ,0x62,"std::string stop_bits_to_text(boost::asio::serial_port_base::stop_bits)")
      ;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "1";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string stop_bits_to_text( boost::asio::serial_port_base::stop_bits b )
{
    using type = boost::asio::serial_port_base::stop_bits::type;

    switch ( b.value() )
    {
        case type::one:
            return "1";
        case type::onepointfive:
            return "1.5";
        case type::two:
            return "2";
    }

    assert( !"can't be" );
}